

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O2

void __thiscall
dg::sdg::DependenceGraph::DependenceGraph(DependenceGraph *this,uint id,SystemDependenceGraph *g)

{
  _Rb_tree_header *p_Var1;
  
  this->_id = id;
  this->_lastNodeID = 0;
  this->_sdg = g;
  (this->_parameters).super_DGParameters._dg = this;
  (this->_callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->_callers)._M_t._M_impl.super__Rb_tree_header;
  (this->_callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_parameters).super_DGParameters._noreturn = (DGNodeArtificial *)0x0;
  (this->_parameters).super_DGParameters._return = (DGNodeArtificial *)0x0;
  (this->_parameters).super_DGParameters._params.
  super__Vector_base<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_parameters).super_DGParameters._params.
  super__Vector_base<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_parameters).super_DGParameters._params.
  super__Vector_base<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_parameters)._vararg._M_t.
  super___uniq_ptr_impl<dg::sdg::DGNodeArtificial,_std::default_delete<dg::sdg::DGNodeArtificial>_>.
  _M_t.
  super__Tuple_impl<0UL,_dg::sdg::DGNodeArtificial_*,_std::default_delete<dg::sdg::DGNodeArtificial>_>
  .super__Head_base<0UL,_dg::sdg::DGNodeArtificial_*,_false>._M_head_impl = (DGNodeArtificial *)0x0;
  (this->_nodes).
  super__Vector_base<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>,_std::allocator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_nodes).
  super__Vector_base<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>,_std::allocator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_nodes).
  super__Vector_base<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>,_std::allocator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_bblocks).
  super__Vector_base<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_bblocks).
  super__Vector_base<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_bblocks).
  super__Vector_base<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_callers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

DependenceGraph(unsigned id, SystemDependenceGraph &g)
            : _id(id), _sdg(g), _parameters(*this) {
        assert(id > 0);
    }